

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wait.cpp
# Opt level: O2

void sc_core::next_trigger(sc_event_and_list *el,sc_simcontext *simc)

{
  if ((int)((ulong)(*(long *)(el + 8) - *(long *)el) >> 3) == 0) {
    sc_report_handler::report
              (SC_ERROR,"invalid use of sc_(and|or)_event_list",
               "next_trigger() on empty event list not allowed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_wait.cpp"
               ,0x142);
  }
  if ((simc->m_curr_proc_info).kind == SC_METHOD_PROC_) {
    sc_method_process::next_trigger((sc_method_process *)(simc->m_curr_proc_info).process_handle,el)
    ;
    return;
  }
  sc_report_handler::report
            (SC_ERROR,"next_trigger() is only allowed in SC_METHODs",
             "\n        in SC_THREADs and SC_CTHREADs use wait() instead",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_wait.cpp"
             ,0x14b);
  return;
}

Assistant:

SC_API void
next_trigger( const sc_event_and_list& el, sc_simcontext* simc )
{
    if( el.empty() ) {
        SC_REPORT_ERROR( SC_ID_EVENT_LIST_FAILED_,
                         "next_trigger() on empty event list not allowed" );
        // may continue, if suppressed
    }

    sc_curr_proc_handle cpi = simc->get_curr_proc_info();
    if( cpi->kind == SC_METHOD_PROC_ ) {
	reinterpret_cast<sc_method_handle>( cpi->process_handle )->next_trigger( el );
    } else {
	SC_REPORT_ERROR( SC_ID_NEXT_TRIGGER_NOT_ALLOWED_, "\n        "
			 "in SC_THREADs and SC_CTHREADs use wait() instead" );
    }
}